

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

bool __thiscall Position::CanKingBeCapturedNow(Position *this)

{
  bool bVar1;
  Moves moves;
  vector<Move,_std::allocator<Move>_> local_28;
  
  if ((this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    GenerateMoves(this);
  }
  std::vector<Move,_std::allocator<Move>_>::vector(&local_28,&(this->m_Moves).m_Moves);
  if ((local_28.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
       _M_start ==
       local_28.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
       _M_finish) ||
     (bVar1 = true,
     (local_28.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
     _M_start)->m_Score < 1000000)) {
    bVar1 = false;
  }
  if (local_28.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

const Moves &GetMoves()
    {
        if ( m_Moves.IsEmpty() )
            GenerateMoves();

        return m_Moves;
    }